

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O0

shared_ptr<miniros::master::NodeRef> __thiscall
miniros::master::RegistrationManager::getNodeByAPIUnsafe(RegistrationManager *this,string *api)

{
  bool bVar1;
  __type_conflict _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<miniros::master::NodeRef> sVar4;
  const_iterator it;
  NodeRef *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  element_type *this_00;
  _Self in_stack_ffffffffffffffb0;
  string local_48 [32];
  _Self local_28;
  _Self local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                *)in_stack_ffffffffffffff88);
  do {
    local_28._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                *)in_stack_ffffffffffffff88);
    bVar1 = ::std::operator!=(local_20,&local_28);
    if (!bVar1) {
      ::std::shared_ptr<miniros::master::NodeRef>::shared_ptr
                ((shared_ptr<miniros::master::NodeRef> *)0x543e6f);
      _Var3._M_pi = extraout_RDX_00;
LAB_00543e6f:
      sVar4.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var3._M_pi;
      sVar4.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI
      ;
      return (shared_ptr<miniros::master::NodeRef>)
             sVar4.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
                  *)0x543df0);
    ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x543dfc);
    NodeRef::getApi_abi_cxx11_(in_stack_ffffffffffffff88);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffb0._M_node,in_RSI);
    in_stack_ffffffffffffff94 = CONCAT13(_Var2,(int3)in_stack_ffffffffffffff94);
    ::std::__cxx11::string::~string(local_48);
    if ((in_stack_ffffffffffffff94 & 0x1000000) != 0) {
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
                    *)0x543e3a);
      ::std::shared_ptr<miniros::master::NodeRef>::shared_ptr
                ((shared_ptr<miniros::master::NodeRef> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (shared_ptr<miniros::master::NodeRef> *)in_stack_ffffffffffffff88);
      _Var3._M_pi = extraout_RDX;
      goto LAB_00543e6f;
    }
    in_stack_ffffffffffffffb0 =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
         ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>
                       *)this_00,in_stack_ffffffffffffff94);
  } while( true );
}

Assistant:

std::shared_ptr<NodeRef> RegistrationManager::getNodeByAPIUnsafe(const std::string& api) const
{
  for (auto it = m_nodes.begin(); it != m_nodes.end(); it++) {
    if (it->second->getApi() == api)
      return it->second;
  }
  return {};
}